

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssh.c
# Opt level: O1

void ssh_bpp_output_raw_data_callback(void *vctx)

{
  bufchain *ch;
  size_t sVar1;
  ulong uVar2;
  ptrlen pVar3;
  
  if (*vctx != 0) {
    ch = (bufchain *)((long)vctx + 0x118);
    do {
      sVar1 = bufchain_size(ch);
      if (sVar1 == 0) {
        ssh_check_frozen((Ssh *)vctx);
        if (*(char *)((long)vctx + 0x168) != '\x01') {
          return;
        }
        (**(code **)(**vctx + 8))();
        *(undefined8 *)vctx = 0;
        (**(code **)(**(long **)((long)vctx + 8) + 0x38))();
        return;
      }
      pVar3 = bufchain_prefix(ch);
      sVar1 = pVar3.len;
      if (*(LogContext **)((long)vctx + 0x60) != (LogContext *)0x0) {
        log_packet(*(LogContext **)((long)vctx + 0x60),1,-1,(char *)0x0,pVar3.ptr,sVar1,0,
                   (logblank_t *)0x0,(unsigned_long *)0x0,0,(char *)0x0);
      }
      uVar2 = (**(code **)(**vctx + 0x10))(*vctx,pVar3.ptr,sVar1);
      bufchain_consume(ch,sVar1);
    } while (uVar2 < 0x8001);
    if (*(char *)((long)vctx + 0xe0) == '\0') {
      *(undefined1 *)((long)vctx + 0xe0) = 1;
      *(ulong *)((long)vctx + 0xd8) = uVar2;
      (**(code **)(*(long *)(*(long *)((long)vctx + 0x1c8) + 8) + 0x90))
                (*(long *)((long)vctx + 0x1c8),1);
      return;
    }
  }
  return;
}

Assistant:

static void ssh_bpp_output_raw_data_callback(void *vctx)
{
    Ssh *ssh = (Ssh *)vctx;

    if (!ssh->s)
        return;

    while (bufchain_size(&ssh->out_raw) > 0) {
        size_t backlog;

        ptrlen data = bufchain_prefix(&ssh->out_raw);

        if (ssh->logctx)
            log_packet(ssh->logctx, PKT_OUTGOING, -1, NULL, data.ptr, data.len,
                       0, NULL, NULL, 0, NULL);
        backlog = sk_write(ssh->s, data.ptr, data.len);

        bufchain_consume(&ssh->out_raw, data.len);

        if (backlog > SSH_MAX_BACKLOG) {
            ssh_throttle_all(ssh, true, backlog);
            return;
        }
    }

    ssh_check_frozen(ssh);

    if (ssh->pending_close) {
        sk_close(ssh->s);
        ssh->s = NULL;
        seat_notify_remote_disconnect(ssh->seat);
    }
}